

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O1

void __thiscall StringBased_Sections_Test::TestBody(StringBased_Sections_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char cVar3;
  bool bVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong extraout_RDX;
  char *pcVar7;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> output;
  stringstream ofile;
  AssertHelper local_1e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  string local_1d0;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> local_1b0;
  stringstream local_198 [16];
  long local_188 [14];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"one=three",9);
  cVar3 = (char)(ostream *)local_188;
  std::ios::widen((char)*(undefined8 *)(local_188[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[second]",8);
  std::ios::widen((char)*(undefined8 *)(local_188[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"  two=four",10);
  std::ios::widen((char)*(undefined8 *)(local_188[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::istream::seekg((long)local_198,_S_beg);
  CLI::detail::parse_ini(&local_1b0,(istream *)local_198);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_1e8.data_ =
       (AssertHelperData *)
       ((long)local_1b0.
              super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1b0.
              super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
              _M_impl.super__Vector_impl_data._M_start >> 6);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_1d0,"(size_t)2","output.size()",(unsigned_long *)&local_1e0,
             (unsigned_long *)&local_1e8);
  if ((char)local_1d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1e0);
    if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_1d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x80,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_1e0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1e0.ptr_ + 8))();
      }
      local_1e0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_1b0.super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_1b0.super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
      _M_impl.super__Vector_impl_data._M_start) {
LAB_0011207b:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0011208d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0011209f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_001120b2:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_001120c5:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    uVar6 = extraout_RDX;
  }
  else {
    CLI::detail::ini_ret_t::name_abi_cxx11_
              (&local_1d0,
               local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&local_1e0,"\"one\"","output.at(0).name()",(char (*) [4])0x1531f2,
               &local_1d0);
    paVar1 = &local_1d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_1e0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d0);
      if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_1d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x81,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)local_1d0._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
        }
        local_1d0._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    if (local_1b0.
        super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1b0.
        super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_0011208d;
    local_1e8.data_ =
         (AssertHelperData *)
         ((long)((local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_start)->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)((local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_start)->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1d0,"(size_t)1","output.at(0).inputs.size()",
               (unsigned_long *)&local_1e0,(unsigned_long *)&local_1e8);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x82,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
        local_1e0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((local_1b0.
         super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl
         .super__Vector_impl_data._M_finish ==
         local_1b0.
         super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl
         .super__Vector_impl_data._M_start) ||
       (pbVar2 = ((local_1b0.
                   super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                   ._M_impl.super__Vector_impl_data._M_start)->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       ((local_1b0.
         super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl
         .super__Vector_impl_data._M_start)->inputs).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish == pbVar2)) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      goto LAB_0011207b;
    }
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&local_1d0,"\"three\"","output.at(0).inputs.at(0)",(char (*) [6])0x15328f
               ,pbVar2);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x83,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
        local_1e0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((ulong)((long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < 2) goto LAB_0011209f;
    CLI::detail::ini_ret_t::name_abi_cxx11_
              (&local_1d0,
               local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&local_1e0,"\"two\"","output.at(1).name()",(char (*) [4])0x1533af,
               &local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_1e0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d0);
      if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_1d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x84,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)local_1d0._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
        }
        local_1d0._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((ulong)((long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < 2) goto LAB_001120b2;
    CLI::detail::ini_ret_t::parent_abi_cxx11_
              (&local_1d0,
               local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
              ((internal *)&local_1e0,"\"second\"","output.at(1).parent()",(char (*) [7])"second",
               &local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_1e0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d0);
      if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_1d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x85,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)local_1d0._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
        }
        local_1d0._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    if ((ulong)((long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < 2) goto LAB_001120c5;
    local_1e8.data_ =
         (AssertHelperData *)
         ((long)local_1b0.
                super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
                _M_impl.super__Vector_impl_data._M_start[1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
                _M_impl.super__Vector_impl_data._M_start[1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1d0,"(size_t)1","output.at(1).inputs.size()",
               (unsigned_long *)&local_1e0,(unsigned_long *)&local_1e8);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x86,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
        local_1e0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar6 = (long)local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    if (1 < uVar6) {
      pbVar2 = local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start[1].inputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_1b0.
          super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
          _M_impl.super__Vector_impl_data._M_start[1].inputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
        testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
                  ((internal *)&local_1d0,"\"four\"","output.at(1).inputs.at(0)",
                   (char (*) [5])0x15329b,pbVar2);
        if ((char)local_1d0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_1e0);
          if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_1d0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                     ,0x87,pcVar7);
          testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
          testing::internal::AssertHelper::~AssertHelper(&local_1e8);
          if (local_1e0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_1e0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1e0.ptr_ + 8))();
            }
            local_1e0.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1d0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::~vector
                  (&local_1b0);
        std::__cxx11::stringstream::~stringstream(local_198);
        std::ios_base::~ios_base(local_118);
        return;
      }
      uVar5 = 0;
      uVar6 = 0;
      goto LAB_001120e3;
    }
  }
  uVar5 = 1;
LAB_001120e3:
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5,uVar6);
  __clang_call_terminate(uVar5);
}

Assistant:

TEST(StringBased, Sections) {
    std::stringstream ofile;

    ofile << "one=three" << std::endl;
    ofile << "[second]" << std::endl;
    ofile << "  two=four" << std::endl;

    ofile.seekg(0, std::ios::beg);

    auto output = CLI::detail::parse_ini(ofile);

    EXPECT_EQ((size_t)2, output.size());
    EXPECT_EQ("one", output.at(0).name());
    EXPECT_EQ((size_t)1, output.at(0).inputs.size());
    EXPECT_EQ("three", output.at(0).inputs.at(0));
    EXPECT_EQ("two", output.at(1).name());
    EXPECT_EQ("second", output.at(1).parent());
    EXPECT_EQ((size_t)1, output.at(1).inputs.size());
    EXPECT_EQ("four", output.at(1).inputs.at(0));
}